

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O2

int Amap_LibNumPinsMax(Amap_Lib_t *p)

{
  void *pvVar1;
  int i;
  uint uVar2;
  
  uVar2 = 0;
  for (i = 0; i < p->vGates->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vGates,i);
    if (uVar2 <= *(byte *)((long)pvVar1 + 0x3b)) {
      uVar2 = (uint)*(byte *)((long)pvVar1 + 0x3b);
    }
  }
  return uVar2;
}

Assistant:

int Amap_LibNumPinsMax( Amap_Lib_t * p )
{
    Amap_Gat_t * pGate;
    int i, Counter = 0;
    Amap_LibForEachGate( p, pGate, i )
        if ( Counter < (int)pGate->nPins )
            Counter = pGate->nPins;
    return Counter;
}